

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeConstraints::setConstrainRegions
          (FluctuatingChargeConstraints *this,bool cr)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  reference piVar4;
  reference pvVar5;
  size_type __new_size;
  vector<int,_std::allocator<int>_> *this_00;
  byte in_SIL;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  iterator r;
  int which;
  iterator iter;
  set<int,_std::less<int>,_std::allocator<int>_> regions;
  vector<int,_std::allocator<int>_> localRegions;
  SimInfo *in_stack_fffffffffffffef8;
  FluctuatingChargeConstraints *in_stack_ffffffffffffff00;
  value_type_conflict1 *in_stack_ffffffffffffff18;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  _Self local_b0;
  _Self local_a8;
  int local_9c;
  _Base_ptr local_98;
  _Base_ptr local_90;
  undefined1 local_88;
  int *local_70;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60 [10];
  byte local_9;
  
  local_9 = in_SIL & 1;
  *(byte *)(in_RDI + 10) = local_9;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_ffffffffffffff00);
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x39c0b3);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x39c0c1);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x39c0cf);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x39c0dd);
  if ((*(byte *)(in_RDI + 10) & 1) != 0) {
    SimInfo::getRegions(in_stack_fffffffffffffef8);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x39c10e);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              (local_60);
    local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
    local_60[0]._M_current = local_68;
    while( true ) {
      local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff00,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffef8);
      if (!bVar2) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_60);
      if (-1 < *piVar3) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (local_60);
        pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        local_90 = (_Base_ptr)pVar6.first._M_node;
        local_88 = pVar6.second;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_60);
    }
    local_98 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffef8);
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff00);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
               (size_type)in_stack_ffffffffffffff18);
    local_9c = 0;
    local_a8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
    while( true ) {
      local_b0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
      bVar2 = std::operator!=(&local_a8,&local_b0);
      iVar1 = local_9c;
      if (!bVar2) break;
      in_stack_ffffffffffffff20 = (set<int,_std::less<int>,_std::allocator<int>_> *)(in_RDI + 0x10);
      piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff00);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                          (long)*piVar4);
      *pvVar5 = iVar1;
      local_9c = local_9c + 1;
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff00);
    }
    __new_size = in_RDI + 0x28;
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,__new_size);
    this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x40);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,__new_size);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,__new_size);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,__new_size);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x39c380);
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::setConstrainRegions(bool cr) {
    constrainRegions_ = cr;

    if (!initialized_) initialize();

    regionKeys_.clear();
    regionForce_.clear();
    regionCMom_.clear();
    regionCharges_.clear();

    if (constrainRegions_) {
      std::vector<int> localRegions = info_->getRegions();

#ifdef IS_MPI
      int size;
      MPI_Comm_size(MPI_COMM_WORLD, &size);
      int mylen = localRegions.size();

      std::vector<int> counts;
      std::vector<int> displs;

      counts.resize(size, 0);
      displs.resize(size, 0);

      MPI_Allgather(&mylen, 1, MPI_INT, &counts[0], 1, MPI_INT, MPI_COMM_WORLD);

      int total = counts[0];

      for (int i = 1; i < size; i++) {
        total += counts[i];
        displs[i] = displs[i - 1] + counts[i - 1];
      }

      std::vector<int> globalRegions(total, 0);

      MPI_Allgatherv(&localRegions[0], mylen, MPI_INT, &globalRegions[0],
                     &counts[0], &displs[0], MPI_INT, MPI_COMM_WORLD);

      localRegions = globalRegions;
#endif

      std::set<int> regions;
      std::vector<int>::iterator iter;
      for (iter = localRegions.begin(); iter != localRegions.end(); ++iter) {
        if (*iter >= 0) regions.insert(*iter);
      }

      // resize the keys vector to the largest found value for regions.
      regionKeys_.resize(*(regions.end()));
      int which = 0;
      for (std::set<int>::iterator r = regions.begin(); r != regions.end();
           ++r) {
        regionKeys_[(*r)] = which;
        which++;
      }
      regionForce_.resize(regionKeys_.size());
      regionCMom_.resize(regionKeys_.size());
      regionCharges_.resize(regionKeys_.size());
      regionChargeMass_.resize(regionKeys_.size());
    }
  }